

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O0

int Imf_2_5::anon_unknown_0::shiftAndRound(int x,int shift)

{
  byte bVar1;
  int b;
  int a;
  int shift_local;
  int x_local;
  
  bVar1 = (byte)shift + 1;
  return (int)(x * 2 + (1 << ((byte)shift & 0x1f)) + -1 + (x * 2 >> (bVar1 & 0x1f) & 1U)) >>
         (bVar1 & 0x1f);
}

Assistant:

inline int
shiftAndRound (int x, int shift)
{
    //
    // Compute
    //
    //     y = x * pow (2, -shift),
    //
    // then round y to the nearest integer.
    // In case of a tie, where y is exactly
    // halfway between two integers, round
    // to the even one.
    //

    x <<= 1;
    int a = (1 << shift) - 1;
    shift += 1;
    int b = (x >> shift) & 1;
    return (x + a + b) >> shift;
}